

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O3

void unitize2d(double x,double y,double *ux,double *uy)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  double c;
  double s;
  double dVar4;
  double dVar5;
  
  if ((y != 0.0) || (NAN(y))) {
    dVar5 = ABS(x);
    if (ABS(y) <= dVar5) {
      dVar4 = (y / x) * (y / x);
    }
    else {
      dVar4 = (x / y) * (x / y);
      dVar5 = ABS(y);
    }
    dVar5 = 1.0 / (SQRT(dVar4 + 1.0) * dVar5);
    uVar3 = -(ulong)(2.98023223877e-08 < ABS(dVar5 + -1.0));
    y = (double)(~uVar3 & (ulong)y | (ulong)(dVar5 * y) & uVar3);
    if (2.98023223877e-08 < ABS(dVar5 + -1.0)) {
      x = x * dVar5;
    }
    if ((2.98023223877e-08 < ABS(y)) && (ABS(x) < 0.9999999701976776)) {
      if ((ABS(x) < 2.98023223877e-08) || (0.9999999701976776 <= ABS(y))) {
        x = 0.0;
        y = *(double *)(&DAT_006994c0 + (ulong)(y < 0.0) * 8);
      }
      goto LAB_00664735;
    }
    y = 0.0;
    bVar2 = x == 0.0;
    bVar1 = 0.0 < x;
  }
  else {
    bVar2 = x == 0.0;
    bVar1 = 0.0 < x;
  }
  x = *(double *)(&DAT_006994c0 + (ulong)(!bVar1 && !bVar2) * 8);
LAB_00664735:
  if (ux != (double *)0x0) {
    *ux = x;
  }
  if (uy != (double *)0x0) {
    *uy = y;
  }
  return;
}

Assistant:

static void unitize2d( double x, double y, double* ux, double* uy )
{
  const double eps = 2.0*ON_SQRT_EPSILON;
  // carefully turn two numbers into a 2d unit vector
  double s, c, d;
  c = x;
  s = y;
  if ( s == 0.0 ) {
    c = (c < 0.0) ? -1.0 : 1.0;
  }
  else {
    if ( fabs(s) > fabs(c) ) {
      d = c/s;
      d = fabs(s)*sqrt(1.0+d*d);
    }
    else {
      d = s/c;
      d = fabs(c)*sqrt(1.0+d*d);
    }
    d = 1.0/d;
    if ( fabs(d-1.0) > eps ) {
      s *= d;
      c *= d;
    }
    if ( fabs(s) <= eps || fabs(c) >= 1.0-eps ) {
      s = 0.0;
      c = (c < 0.0) ? -1.0 : 1.0;
    }
    else if ( fabs(c) < eps || fabs(s) >= 1.0-eps) {
      c = 0.0;
      s = (s < 0.0) ? -1.0 : 1.0;
    }
  }
  if ( ux ) 
    *ux = c;
  if ( uy )
    *uy = s;
}